

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

xmlChar * xmlDictLookup(xmlDictPtr dict,xmlChar *name,int len)

{
  ulong uVar1;
  xmlChar *pxVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  xmlDictStringsPtr_conflict pxVar8;
  _xmlDictEntry *p_Var9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  _xmlDictEntry *p_Var13;
  _xmlDictEntry *p_Var14;
  _xmlDict *__s1;
  xmlChar *pxVar15;
  uint namelen;
  ulong uVar16;
  _xmlDictEntry *p_Var17;
  ulong uVar18;
  ulong local_58;
  
  if (name == (xmlChar *)0x0 || dict == (xmlDictPtr)0x0) {
    return (xmlChar *)0x0;
  }
  sVar5 = (size_t)(uint)len;
  if (len < 0) {
    sVar5 = strlen((char *)name);
  }
  uVar18 = dict->limit;
  namelen = (uint)sVar5;
  if (uVar18 == 0) {
    if (0x3fffffff < namelen) {
      return (xmlChar *)0x0;
    }
  }
  else if (0x3fffffff < namelen || uVar18 <= (sVar5 & 0xffffffff)) {
    return (xmlChar *)0x0;
  }
  uVar12 = dict->size;
  if (uVar12 == 0x80) {
    uVar6 = xmlDictComputeFastKey(name,namelen,dict->seed);
  }
  else if ((int)namelen < 1) {
    uVar6 = 0;
  }
  else {
    uVar10 = dict->seed;
    uVar16 = 0;
    do {
      uVar10 = (name[uVar16] + uVar10) * 0x401;
      uVar10 = uVar10 >> 6 ^ uVar10;
      uVar16 = uVar16 + 1;
    } while ((sVar5 & 0xffffffff) != uVar16);
    uVar6 = (unsigned_long)((uVar10 * 9 >> 0xb ^ uVar10 * 9) * 0x8001);
  }
  uVar16 = 0;
  local_58 = uVar6 % uVar12;
  if (dict->dict[local_58].valid == 0) {
    p_Var14 = (_xmlDictEntry *)0x0;
  }
  else {
    p_Var14 = dict->dict + local_58;
    if (p_Var14->next == (_xmlDictEntry *)0x0) {
      uVar16 = 0;
    }
    else {
      uVar16 = 0;
      p_Var9 = p_Var14->next;
      p_Var13 = p_Var14;
      do {
        p_Var14 = p_Var9;
        if ((p_Var13->okey == uVar6) && (p_Var13->len == namelen)) {
          pxVar15 = p_Var13->name;
          iVar4 = bcmp(pxVar15,name,sVar5 & 0xffffffff);
          if (iVar4 == 0) {
            return pxVar15;
          }
        }
        uVar16 = uVar16 + 1;
        p_Var9 = p_Var14->next;
        p_Var13 = p_Var14;
      } while (p_Var14->next != (_xmlDictEntry *)0x0);
    }
    if ((p_Var14->okey == uVar6) && (p_Var14->len == namelen)) {
      pxVar15 = p_Var14->name;
      iVar4 = bcmp(pxVar15,name,sVar5 & 0xffffffff);
      if (iVar4 == 0) {
        return pxVar15;
      }
    }
  }
  __s1 = dict->subdict;
  if (__s1 == (_xmlDict *)0x0) goto LAB_00141b99;
  uVar7 = uVar6;
  if (uVar12 == 0x80) {
    if (__s1->size != 0x80) {
LAB_00141a79:
      if (__s1->size == 0x80) {
        uVar7 = xmlDictComputeFastKey(name,namelen,__s1->seed);
      }
      else if ((int)namelen < 1) {
        uVar7 = 0;
      }
      else {
        uVar10 = __s1->seed;
        uVar12 = 0;
        do {
          uVar10 = (name[uVar12] + uVar10) * 0x401;
          uVar10 = uVar10 >> 6 ^ uVar10;
          uVar12 = uVar12 + 1;
        } while ((sVar5 & 0xffffffff) != uVar12);
        uVar7 = (ulong)((uVar10 * 9 >> 0xb ^ uVar10 * 9) * 0x8001);
      }
    }
  }
  else if (__s1->size == 0x80) goto LAB_00141a79;
  uVar12 = uVar7 % __s1->size;
  if (__s1->dict[uVar12].valid == 0) {
    bVar3 = true;
  }
  else {
    p_Var9 = __s1->dict + uVar12;
    if (p_Var9->next != (_xmlDictEntry *)0x0) {
      p_Var13 = p_Var9->next;
      p_Var17 = p_Var9;
      do {
        p_Var9 = p_Var13;
        if ((p_Var17->okey == uVar7) && (p_Var17->len == namelen)) {
          __s1 = (_xmlDict *)p_Var17->name;
          iVar4 = bcmp(__s1,name,sVar5 & 0xffffffff);
          if (iVar4 == 0) goto LAB_00141b78;
        }
        uVar16 = uVar16 + 1;
        p_Var13 = p_Var9->next;
        p_Var17 = p_Var9;
      } while (p_Var9->next != (_xmlDictEntry *)0x0);
    }
    if ((p_Var9->okey == uVar7) && (p_Var9->len == namelen)) {
      __s1 = (_xmlDict *)p_Var9->name;
      iVar4 = bcmp(__s1,name,sVar5 & 0xffffffff);
      if (iVar4 != 0) goto LAB_00141b70;
LAB_00141b78:
      bVar3 = false;
    }
    else {
LAB_00141b70:
      bVar3 = true;
    }
    if (!bVar3) {
      local_58 = uVar12;
    }
  }
  if (!bVar3) {
    return (xmlChar *)__s1;
  }
LAB_00141b99:
  pxVar8 = dict->strings;
  if (pxVar8 == (xmlDictStringsPtr_conflict)0x0) {
    uVar12 = 0;
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    uVar12 = 0;
    do {
      if ((sVar5 & 0xffffffff) < (ulong)((long)pxVar8->end - (long)pxVar8->free)) goto LAB_00141c67;
      uVar1 = pxVar8->size;
      if (uVar12 < uVar1) {
        uVar12 = uVar1;
      }
      pxVar8 = pxVar8->next;
      uVar11 = uVar11 + uVar1;
    } while (pxVar8 != (xmlDictStringsPtr)0x0);
  }
  if ((uVar18 == 0) || (uVar11 <= uVar18)) {
    uVar18 = 1000;
    if (uVar12 != 0) {
      uVar18 = uVar12 * 4;
    }
    if (uVar18 <= namelen * 4) {
      uVar18 = (ulong)(namelen * 4);
    }
    pxVar8 = (xmlDictStringsPtr_conflict)(*xmlMalloc)(uVar18 + 0x30);
    if (pxVar8 == (xmlDictStringsPtr_conflict)0x0) {
      pxVar15 = (xmlChar *)0x0;
    }
    else {
      pxVar8->size = uVar18;
      pxVar8->nbStrings = 0;
      pxVar8->free = pxVar8->array;
      pxVar8->end = pxVar8->array + uVar18;
      pxVar8->next = dict->strings;
      dict->strings = pxVar8;
LAB_00141c67:
      pxVar15 = pxVar8->free;
      memcpy(pxVar15,name,sVar5 & 0xffffffff);
      pxVar2 = pxVar8->free;
      pxVar8->free = pxVar2 + (sVar5 & 0xffffffff) + 1;
      pxVar2[sVar5 & 0xffffffff] = '\0';
      pxVar8->nbStrings = pxVar8->nbStrings + 1;
    }
  }
  else {
    pxVar15 = (xmlChar *)0x0;
  }
  if (pxVar15 != (xmlChar *)0x0) {
    if (p_Var14 == (_xmlDictEntry *)0x0) {
      p_Var9 = dict->dict + local_58;
    }
    else {
      p_Var9 = (_xmlDictEntry *)(*xmlMalloc)(0x20);
      if (p_Var9 == (_xmlDictEntry *)0x0) {
        return (xmlChar *)0x0;
      }
    }
    p_Var9->name = pxVar15;
    p_Var9->len = namelen;
    p_Var9->next = (_xmlDictEntry *)0x0;
    p_Var9->valid = 1;
    p_Var9->okey = uVar6;
    if (p_Var14 != (_xmlDictEntry *)0x0) {
      p_Var14->next = p_Var9;
    }
    dict->nbElems = dict->nbElems + 1;
    if (uVar16 < 4) {
      return pxVar15;
    }
    if (0xaaa < dict->size) {
      return pxVar15;
    }
    iVar4 = xmlDictGrow(dict,dict->size * 6);
    if (iVar4 == 0) {
      return pxVar15;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlDictLookup(xmlDictPtr dict, const xmlChar *name, int len) {
    unsigned long key, okey, nbi = 0;
    xmlDictEntryPtr entry;
    xmlDictEntryPtr insert;
    const xmlChar *ret;
    unsigned int l;

    if ((dict == NULL) || (name == NULL))
	return(NULL);

    if (len < 0)
        l = strlen((const char *) name);
    else
        l = len;

    if (((dict->limit > 0) && (l >= dict->limit)) ||
        (l > INT_MAX / 2))
        return(NULL);

    /*
     * Check for duplicate and insertion location.
     */
    okey = xmlDictComputeKey(dict, name, l);
    key = okey % dict->size;
    if (dict->dict[key].valid == 0) {
	insert = NULL;
    } else {
	for (insert = &(dict->dict[key]); insert->next != NULL;
	     insert = insert->next) {
#ifdef __GNUC__
	    if ((insert->okey == okey) && (insert->len == l)) {
		if (!memcmp(insert->name, name, l))
		    return(insert->name);
	    }
#else
	    if ((insert->okey == okey) && (insert->len == l) &&
	        (!xmlStrncmp(insert->name, name, l)))
		return(insert->name);
#endif
	    nbi++;
	}
#ifdef __GNUC__
	if ((insert->okey == okey) && (insert->len == l)) {
	    if (!memcmp(insert->name, name, l))
		return(insert->name);
	}
#else
	if ((insert->okey == okey) && (insert->len == l) &&
	    (!xmlStrncmp(insert->name, name, l)))
	    return(insert->name);
#endif
    }

    if (dict->subdict) {
        unsigned long skey;

        /* we cannot always reuse the same okey for the subdict */
        if (((dict->size == MIN_DICT_SIZE) &&
	     (dict->subdict->size != MIN_DICT_SIZE)) ||
            ((dict->size != MIN_DICT_SIZE) &&
	     (dict->subdict->size == MIN_DICT_SIZE)))
	    skey = xmlDictComputeKey(dict->subdict, name, l);
	else
	    skey = okey;

	key = skey % dict->subdict->size;
	if (dict->subdict->dict[key].valid != 0) {
	    xmlDictEntryPtr tmp;

	    for (tmp = &(dict->subdict->dict[key]); tmp->next != NULL;
		 tmp = tmp->next) {
#ifdef __GNUC__
		if ((tmp->okey == skey) && (tmp->len == l)) {
		    if (!memcmp(tmp->name, name, l))
			return(tmp->name);
		}
#else
		if ((tmp->okey == skey) && (tmp->len == l) &&
		    (!xmlStrncmp(tmp->name, name, l)))
		    return(tmp->name);
#endif
		nbi++;
	    }
#ifdef __GNUC__
	    if ((tmp->okey == skey) && (tmp->len == l)) {
		if (!memcmp(tmp->name, name, l))
		    return(tmp->name);
	    }
#else
	    if ((tmp->okey == skey) && (tmp->len == l) &&
		(!xmlStrncmp(tmp->name, name, l)))
		return(tmp->name);
#endif
	}
	key = okey % dict->size;
    }

    ret = xmlDictAddString(dict, name, l);
    if (ret == NULL)
        return(NULL);
    if (insert == NULL) {
	entry = &(dict->dict[key]);
    } else {
	entry = xmlMalloc(sizeof(xmlDictEntry));
	if (entry == NULL)
	     return(NULL);
    }
    entry->name = ret;
    entry->len = l;
    entry->next = NULL;
    entry->valid = 1;
    entry->okey = okey;


    if (insert != NULL)
	insert->next = entry;

    dict->nbElems++;

    if ((nbi > MAX_HASH_LEN) &&
        (dict->size <= ((MAX_DICT_HASH / 2) / MAX_HASH_LEN))) {
	if (xmlDictGrow(dict, MAX_HASH_LEN * 2 * dict->size) != 0)
	    return(NULL);
    }
    /* Note that entry may have been freed at this point by xmlDictGrow */

    return(ret);
}